

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprpc.cpp
# Opt level: O2

void __thiscall mprpc::MpRpcClient::on_recv(MpRpcClient *this,char *data,size_t size)

{
  element_type *peVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  rep rVar3;
  __shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2> _Stack_60;
  shared_ptr<mprpc::MpRpcMessage> rpcmsg;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_38;
  code *local_28;
  code *apcStack_20 [2];
  
  MpRpcMessage::parse((MpRpcMessage *)&rpcmsg,data,size);
  if (rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    rVar3 = std::chrono::_V2::system_clock::now();
    ((rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->recv_time)
    .__d.__r = rVar3;
    std::__shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&_Stack_60,
               &rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>);
    local_28 = (code *)0x0;
    apcStack_20[0] = (code *)0x0;
    local_38._M_allocated_capacity = 0;
    local_38._8_8_ = 0;
    local_38._M_allocated_capacity = (size_type)operator_new(0x18);
    _Var2._M_pi = _Stack_60._M_refcount._M_pi;
    peVar1 = _Stack_60._M_ptr;
    _Stack_60._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    _Stack_60._M_ptr = (element_type *)0x0;
    *(MpRpcClient **)local_38._M_allocated_capacity = this;
    *(element_type **)(local_38._M_allocated_capacity + 8) = peVar1;
    *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(local_38._M_allocated_capacity + 0x10) =
         _Var2._M_pi;
    apcStack_20[0] =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:170:30)>
         ::_M_invoke;
    local_28 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/xutiezhu[P]tqapi/lib/myutils/mprpc.cpp:170:30)>
               ::_M_manager;
    loop::MessageLoop::post_task(&(this->super_MsgLoopRun).m_msg_loop,(Closure *)&local_38);
    std::_Function_base::~_Function_base((_Function_base *)&local_38);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_60._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&rpcmsg.super___shared_ptr<mprpc::MpRpcMessage,_(__gnu_cxx::_Lock_policy)2>._M_refcount
            );
  return;
}

Assistant:

void MpRpcClient::on_recv(const char* data, size_t size)
    {
        shared_ptr<MpRpcMessage> rpcmsg = MpRpcMessage::parse(data, size);
        if (!rpcmsg) return;

        rpcmsg->recv_time = system_clock::now();

        msg_loop().post_task([this, rpcmsg]() {
            if (rpcmsg->method == ".sys.heartbeat") {

                m_last_hb_rsp_time = system_clock::now();

                if (!m_connected) {
                    m_connected = true;
                    if (m_callback) m_callback->on_connected();
                }
                if (m_callback) m_callback->on_notification(rpcmsg);
            }
            else if (rpcmsg->id) {
                auto it = m_on_rsp_map.find(rpcmsg->id);
                if (it != m_on_rsp_map.end()) {
                    auto rsp = it->second.promise;
                    m_on_rsp_map.erase(it);
                    rsp->set_value(rpcmsg);
                }
            }
            else {
                // Notification message
                if (m_callback && !rpcmsg->method.empty())
                    m_callback->on_notification(rpcmsg);
            }
        });
    }